

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O3

void initRegularSlotDevice
               (CDevice *device,int32_t slotSize,int32_t slotCount,int pageCount,int *initialPages)

{
  int iVar1;
  byte *memory;
  CDevicePage *pCVar2;
  byte *memPtr;
  int32_t adr;
  long lVar3;
  ulong __n;
  CDeviceSlot *pCVar4;
  
  if (0 < slotCount * slotSize) {
    adr = 0;
    do {
      CDevice::AddSlot(device,adr,slotSize);
      adr = adr + slotSize;
    } while (adr < slotCount * slotSize);
  }
  __n = (ulong)(pageCount * slotSize);
  memory = (byte *)operator_new__(__n);
  memset(memory,0,__n);
  device->Memory = memory;
  if (0 < pageCount * slotSize) {
    do {
      CDevice::AddPage(device,memory,slotSize);
      memory = memory + slotSize;
    } while (memory < device->Memory + __n);
  }
  if (0 < device->SlotsCount) {
    lVar3 = 0;
    do {
      pCVar4 = device->Slots[lVar3];
      if (pCVar4 == (CDeviceSlot *)0x0) {
        Error("Wrong slot number",lp,PASS3);
        pCVar4 = device->Slots[0];
      }
      pCVar2 = device->Pages[initialPages[lVar3]];
      if (pCVar2 == (CDevicePage *)0x0) {
        Error("Wrong page number",lp,PASS3);
        pCVar2 = device->Pages[0];
      }
      pCVar4->Page = pCVar2;
      pCVar4->InitialPage = (int16_t)pCVar2->Number;
      lVar3 = lVar3 + 1;
      iVar1 = device->SlotsCount;
    } while (lVar3 < iVar1);
    if ((0 < iVar1) && (device->Slots[iVar1 - 1U] != (CDeviceSlot *)0x0)) {
      device->CurrentSlot = iVar1 - 1U;
    }
  }
  return;
}

Assistant:

static void initRegularSlotDevice(CDevice* const device, const int32_t slotSize, const int32_t slotCount,
								  const int pageCount, const int* const initialPages) {
	for (int32_t slotAddress = 0; slotAddress < slotSize * slotCount; slotAddress += slotSize) {
		device->AddSlot(slotAddress, slotSize);
	}
	device->Memory = new byte[slotSize * pageCount]();
	for (byte* memPtr = device->Memory; memPtr < device->Memory + slotSize * pageCount; memPtr += slotSize) {
		device->AddPage(memPtr, slotSize);
	}
	for (int i = 0; i < device->SlotsCount; ++i) {
		CDeviceSlot* slot = device->GetSlot(i);
		slot->Page = device->GetPage(initialPages[i]);
		slot->InitialPage = slot->Page->Number;
	}
	device->SetSlot(device->SlotsCount - 1);
}